

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_uint64 ma_dr_wav_read_pcm_frames_s16__msadpcm
                    (ma_dr_wav *pWav,ma_uint64 framesToRead,ma_int16 *pBufferOut)

{
  ushort uVar1;
  ulong uVar2;
  byte bVar3;
  ma_int32 newSample0;
  ma_uint32 mVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  uint uVar8;
  int iVar9;
  ma_uint64 mVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  ma_uint64 mVar14;
  ma_uint64 mVar15;
  ma_uint8 header [7];
  undefined1 uStack_3f;
  short local_3e;
  short local_3c;
  short local_3a;
  
  mVar14 = 0;
LAB_00153768:
  do {
    mVar15 = mVar14;
    mVar10 = framesToRead;
    if (pWav->totalPCMFrameCount <= pWav->readCursorInPCMFrames) {
      return mVar15;
    }
    mVar4 = (pWav->msadpcm).cachedFrameCount;
    framesToRead = mVar10;
    mVar14 = mVar15;
    if ((mVar4 == 0) && (mVar4 = 0, (pWav->msadpcm).bytesRemainingInBlock == 0)) {
      if (pWav->channels == 1) {
        sVar7 = (*pWav->onRead)(pWav->pUserData,header,7);
        if (sVar7 != 7) {
          return mVar15;
        }
        (pWav->msadpcm).bytesRemainingInBlock = (pWav->fmt).blockAlign - 7;
        (pWav->msadpcm).predictor[0] = (ushort)header[0];
        (pWav->msadpcm).delta[0] = (int)CONCAT11(header[2],header[1]);
        (pWav->msadpcm).prevFrames[0][1] = (int)CONCAT11(header[4],header[3]);
        (pWav->msadpcm).prevFrames[0][0] = (int)CONCAT11(header[6],header[5]);
        (pWav->msadpcm).cachedFrames[2] = (int)CONCAT11(header[6],header[5]);
        (pWav->msadpcm).cachedFrames[3] = (int)CONCAT11(header[4],header[3]);
        (pWav->msadpcm).cachedFrameCount = 2;
        mVar4 = 2;
        if (6 < header[0]) {
          return mVar15;
        }
      }
      else {
        sVar7 = (*pWav->onRead)(pWav->pUserData,header,0xe);
        if (sVar7 != 0xe) {
          return mVar15;
        }
        (pWav->msadpcm).bytesRemainingInBlock = (pWav->fmt).blockAlign - 0xe;
        (pWav->msadpcm).predictor[0] = (ushort)header[0];
        (pWav->msadpcm).predictor[1] = (ushort)header[1];
        (pWav->msadpcm).delta[0] = (int)CONCAT11(header[3],header[2]);
        (pWav->msadpcm).delta[1] = (int)CONCAT11(header[5],header[4]);
        (pWav->msadpcm).prevFrames[0][1] = (int)CONCAT11(uStack_3f,header[6]);
        (pWav->msadpcm).prevFrames[1][1] = (int)local_3e;
        (pWav->msadpcm).prevFrames[0][0] = (int)local_3c;
        (pWav->msadpcm).prevFrames[1][0] = (int)local_3a;
        (pWav->msadpcm).cachedFrames[0] = (int)local_3c;
        (pWav->msadpcm).cachedFrames[1] = (int)local_3a;
        (pWav->msadpcm).cachedFrames[2] = (int)CONCAT11(uStack_3f,header[6]);
        (pWav->msadpcm).cachedFrames[3] = (int)local_3e;
        (pWav->msadpcm).cachedFrameCount = 2;
        if (6 < header[0]) {
          return mVar15;
        }
        mVar4 = 2;
        if (6 < header[1]) {
          return mVar15;
        }
      }
    }
    while( true ) {
      if (framesToRead == 0) {
        return mVar15 + mVar10;
      }
      if (mVar4 == 0) break;
      uVar2 = pWav->readCursorInPCMFrames;
      if (pWav->totalPCMFrameCount <= uVar2) goto LAB_00153768;
      if (pBufferOut == (ma_int16 *)0x0) {
        pBufferOut = (ma_int16 *)0x0;
      }
      else {
        uVar13 = 0;
        while( true ) {
          uVar1 = pWav->channels;
          if (uVar1 <= uVar13) break;
          pBufferOut[uVar13] =
               *(ma_int16 *)((long)pWav + uVar13 * 4 + (ulong)(mVar4 * uVar1) * -4 + 0x120);
          uVar13 = uVar13 + 1;
        }
        pBufferOut = pBufferOut + uVar1;
      }
      pWav->readCursorInPCMFrames = uVar2 + 1;
      (pWav->msadpcm).cachedFrameCount = mVar4 - 1;
      framesToRead = framesToRead - 1;
      mVar14 = mVar14 + 1;
      mVar4 = mVar4 - 1;
    }
    if ((pWav->msadpcm).bytesRemainingInBlock != 0) {
      sVar7 = (*pWav->onRead)(pWav->pUserData,header,1);
      if (sVar7 != 1) {
        return mVar14;
      }
      (pWav->msadpcm).bytesRemainingInBlock = (pWav->msadpcm).bytesRemainingInBlock - 1;
      bVar3 = header[0] >> 4;
      uVar5 = (int)(char)(bVar3 - 0x10);
      if (-1 < (char)header[0]) {
        uVar5 = (uint)bVar3;
      }
      uVar8 = (int)((uint)header[0] << 0x1c) >> 0x1f & 0xfffffff0U | header[0] & 0xf;
      iVar12 = (pWav->msadpcm).prevFrames[0][1];
      uVar1 = (pWav->msadpcm).predictor[0];
      iVar11 = (pWav->msadpcm).delta[0];
      iVar6 = uVar5 * iVar11 +
              ((pWav->msadpcm).prevFrames[0][0] *
               ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff2Table[uVar1] +
               ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff1Table[uVar1] * iVar12 >> 8);
      if (0x7ffe < iVar6) {
        iVar6 = 0x7fff;
      }
      if (iVar6 < -0x7fff) {
        iVar6 = -0x8000;
      }
      iVar11 = iVar11 * ma_dr_wav_read_pcm_frames_s16__msadpcm::adaptationTable[(uint)bVar3] >> 8;
      if (iVar11 < 0x11) {
        iVar11 = 0x10;
      }
      if (pWav->channels == 1) {
        iVar9 = uVar8 * iVar11 +
                (ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff2Table[uVar1] * iVar12 +
                 ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff1Table[uVar1] * iVar6 >> 8);
        if (0x7ffe < iVar9) {
          iVar9 = 0x7fff;
        }
        if (iVar9 < -0x7fff) {
          iVar9 = -0x8000;
        }
        iVar12 = iVar11 * ma_dr_wav_read_pcm_frames_s16__msadpcm::adaptationTable[header[0] & 0xf]
                 >> 8;
        if (iVar12 < 0x11) {
          iVar12 = 0x10;
        }
        (pWav->msadpcm).delta[0] = iVar12;
        (pWav->msadpcm).prevFrames[0][0] = iVar6;
        (pWav->msadpcm).prevFrames[0][1] = iVar9;
        mVar4 = 2;
      }
      else {
        (pWav->msadpcm).delta[0] = iVar11;
        (pWav->msadpcm).prevFrames[0][0] = iVar12;
        (pWav->msadpcm).prevFrames[0][1] = iVar6;
        iVar12 = (pWav->msadpcm).delta[1];
        iVar11 = (pWav->msadpcm).prevFrames[1][1];
        uVar1 = (pWav->msadpcm).predictor[1];
        iVar9 = uVar8 * iVar12 +
                (ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff2Table[uVar1] *
                 (pWav->msadpcm).prevFrames[1][0] +
                 ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff1Table[uVar1] * iVar11 >> 8);
        if (0x7ffe < iVar9) {
          iVar9 = 0x7fff;
        }
        if (iVar9 < -0x7fff) {
          iVar9 = -0x8000;
        }
        iVar12 = iVar12 * ma_dr_wav_read_pcm_frames_s16__msadpcm::adaptationTable[header[0] & 0xf]
                 >> 8;
        if (iVar12 < 0x11) {
          iVar12 = 0x10;
        }
        (pWav->msadpcm).delta[1] = iVar12;
        (pWav->msadpcm).prevFrames[1][0] = iVar11;
        (pWav->msadpcm).prevFrames[1][1] = iVar9;
        mVar4 = 1;
      }
      (pWav->msadpcm).cachedFrames[2] = iVar6;
      (pWav->msadpcm).cachedFrames[3] = iVar9;
      (pWav->msadpcm).cachedFrameCount = mVar4;
    }
  } while( true );
}

Assistant:

MA_PRIVATE ma_uint64 ma_dr_wav_read_pcm_frames_s16__msadpcm(ma_dr_wav* pWav, ma_uint64 framesToRead, ma_int16* pBufferOut)
{
    ma_uint64 totalFramesRead = 0;
    static ma_int32 adaptationTable[] = {
        230, 230, 230, 230, 307, 409, 512, 614,
        768, 614, 512, 409, 307, 230, 230, 230
    };
    static ma_int32 coeff1Table[] = { 256, 512, 0, 192, 240, 460,  392 };
    static ma_int32 coeff2Table[] = { 0,  -256, 0, 64,  0,  -208, -232 };
    MA_DR_WAV_ASSERT(pWav != NULL);
    MA_DR_WAV_ASSERT(framesToRead > 0);
    while (pWav->readCursorInPCMFrames < pWav->totalPCMFrameCount) {
        MA_DR_WAV_ASSERT(framesToRead > 0);
        if (pWav->msadpcm.cachedFrameCount == 0 && pWav->msadpcm.bytesRemainingInBlock == 0) {
            if (pWav->channels == 1) {
                ma_uint8 header[7];
                if (pWav->onRead(pWav->pUserData, header, sizeof(header)) != sizeof(header)) {
                    return totalFramesRead;
                }
                pWav->msadpcm.bytesRemainingInBlock = pWav->fmt.blockAlign - sizeof(header);
                pWav->msadpcm.predictor[0]     = header[0];
                pWav->msadpcm.delta[0]         = ma_dr_wav_bytes_to_s16(header + 1);
                pWav->msadpcm.prevFrames[0][1] = (ma_int32)ma_dr_wav_bytes_to_s16(header + 3);
                pWav->msadpcm.prevFrames[0][0] = (ma_int32)ma_dr_wav_bytes_to_s16(header + 5);
                pWav->msadpcm.cachedFrames[2]  = pWav->msadpcm.prevFrames[0][0];
                pWav->msadpcm.cachedFrames[3]  = pWav->msadpcm.prevFrames[0][1];
                pWav->msadpcm.cachedFrameCount = 2;
                if (pWav->msadpcm.predictor[0] >= ma_dr_wav_countof(coeff1Table)) {
                    return totalFramesRead;
                }
            } else {
                ma_uint8 header[14];
                if (pWav->onRead(pWav->pUserData, header, sizeof(header)) != sizeof(header)) {
                    return totalFramesRead;
                }
                pWav->msadpcm.bytesRemainingInBlock = pWav->fmt.blockAlign - sizeof(header);
                pWav->msadpcm.predictor[0] = header[0];
                pWav->msadpcm.predictor[1] = header[1];
                pWav->msadpcm.delta[0] = ma_dr_wav_bytes_to_s16(header + 2);
                pWav->msadpcm.delta[1] = ma_dr_wav_bytes_to_s16(header + 4);
                pWav->msadpcm.prevFrames[0][1] = (ma_int32)ma_dr_wav_bytes_to_s16(header + 6);
                pWav->msadpcm.prevFrames[1][1] = (ma_int32)ma_dr_wav_bytes_to_s16(header + 8);
                pWav->msadpcm.prevFrames[0][0] = (ma_int32)ma_dr_wav_bytes_to_s16(header + 10);
                pWav->msadpcm.prevFrames[1][0] = (ma_int32)ma_dr_wav_bytes_to_s16(header + 12);
                pWav->msadpcm.cachedFrames[0] = pWav->msadpcm.prevFrames[0][0];
                pWav->msadpcm.cachedFrames[1] = pWav->msadpcm.prevFrames[1][0];
                pWav->msadpcm.cachedFrames[2] = pWav->msadpcm.prevFrames[0][1];
                pWav->msadpcm.cachedFrames[3] = pWav->msadpcm.prevFrames[1][1];
                pWav->msadpcm.cachedFrameCount = 2;
                if (pWav->msadpcm.predictor[0] >= ma_dr_wav_countof(coeff1Table) || pWav->msadpcm.predictor[1] >= ma_dr_wav_countof(coeff2Table)) {
                    return totalFramesRead;
                }
            }
        }
        while (framesToRead > 0 && pWav->msadpcm.cachedFrameCount > 0 && pWav->readCursorInPCMFrames < pWav->totalPCMFrameCount) {
            if (pBufferOut != NULL) {
                ma_uint32 iSample = 0;
                for (iSample = 0; iSample < pWav->channels; iSample += 1) {
                    pBufferOut[iSample] = (ma_int16)pWav->msadpcm.cachedFrames[(ma_dr_wav_countof(pWav->msadpcm.cachedFrames) - (pWav->msadpcm.cachedFrameCount*pWav->channels)) + iSample];
                }
                pBufferOut += pWav->channels;
            }
            framesToRead    -= 1;
            totalFramesRead += 1;
            pWav->readCursorInPCMFrames += 1;
            pWav->msadpcm.cachedFrameCount -= 1;
        }
        if (framesToRead == 0) {
            break;
        }
        if (pWav->msadpcm.cachedFrameCount == 0) {
            if (pWav->msadpcm.bytesRemainingInBlock == 0) {
                continue;
            } else {
                ma_uint8 nibbles;
                ma_int32 nibble0;
                ma_int32 nibble1;
                if (pWav->onRead(pWav->pUserData, &nibbles, 1) != 1) {
                    return totalFramesRead;
                }
                pWav->msadpcm.bytesRemainingInBlock -= 1;
                nibble0 = ((nibbles & 0xF0) >> 4); if ((nibbles & 0x80)) { nibble0 |= 0xFFFFFFF0UL; }
                nibble1 = ((nibbles & 0x0F) >> 0); if ((nibbles & 0x08)) { nibble1 |= 0xFFFFFFF0UL; }
                if (pWav->channels == 1) {
                    ma_int32 newSample0;
                    ma_int32 newSample1;
                    newSample0  = ((pWav->msadpcm.prevFrames[0][1] * coeff1Table[pWav->msadpcm.predictor[0]]) + (pWav->msadpcm.prevFrames[0][0] * coeff2Table[pWav->msadpcm.predictor[0]])) >> 8;
                    newSample0 += nibble0 * pWav->msadpcm.delta[0];
                    newSample0  = ma_dr_wav_clamp(newSample0, -32768, 32767);
                    pWav->msadpcm.delta[0] = (adaptationTable[((nibbles & 0xF0) >> 4)] * pWav->msadpcm.delta[0]) >> 8;
                    if (pWav->msadpcm.delta[0] < 16) {
                        pWav->msadpcm.delta[0] = 16;
                    }
                    pWav->msadpcm.prevFrames[0][0] = pWav->msadpcm.prevFrames[0][1];
                    pWav->msadpcm.prevFrames[0][1] = newSample0;
                    newSample1  = ((pWav->msadpcm.prevFrames[0][1] * coeff1Table[pWav->msadpcm.predictor[0]]) + (pWav->msadpcm.prevFrames[0][0] * coeff2Table[pWav->msadpcm.predictor[0]])) >> 8;
                    newSample1 += nibble1 * pWav->msadpcm.delta[0];
                    newSample1  = ma_dr_wav_clamp(newSample1, -32768, 32767);
                    pWav->msadpcm.delta[0] = (adaptationTable[((nibbles & 0x0F) >> 0)] * pWav->msadpcm.delta[0]) >> 8;
                    if (pWav->msadpcm.delta[0] < 16) {
                        pWav->msadpcm.delta[0] = 16;
                    }
                    pWav->msadpcm.prevFrames[0][0] = pWav->msadpcm.prevFrames[0][1];
                    pWav->msadpcm.prevFrames[0][1] = newSample1;
                    pWav->msadpcm.cachedFrames[2] = newSample0;
                    pWav->msadpcm.cachedFrames[3] = newSample1;
                    pWav->msadpcm.cachedFrameCount = 2;
                } else {
                    ma_int32 newSample0;
                    ma_int32 newSample1;
                    newSample0  = ((pWav->msadpcm.prevFrames[0][1] * coeff1Table[pWav->msadpcm.predictor[0]]) + (pWav->msadpcm.prevFrames[0][0] * coeff2Table[pWav->msadpcm.predictor[0]])) >> 8;
                    newSample0 += nibble0 * pWav->msadpcm.delta[0];
                    newSample0  = ma_dr_wav_clamp(newSample0, -32768, 32767);
                    pWav->msadpcm.delta[0] = (adaptationTable[((nibbles & 0xF0) >> 4)] * pWav->msadpcm.delta[0]) >> 8;
                    if (pWav->msadpcm.delta[0] < 16) {
                        pWav->msadpcm.delta[0] = 16;
                    }
                    pWav->msadpcm.prevFrames[0][0] = pWav->msadpcm.prevFrames[0][1];
                    pWav->msadpcm.prevFrames[0][1] = newSample0;
                    newSample1  = ((pWav->msadpcm.prevFrames[1][1] * coeff1Table[pWav->msadpcm.predictor[1]]) + (pWav->msadpcm.prevFrames[1][0] * coeff2Table[pWav->msadpcm.predictor[1]])) >> 8;
                    newSample1 += nibble1 * pWav->msadpcm.delta[1];
                    newSample1  = ma_dr_wav_clamp(newSample1, -32768, 32767);
                    pWav->msadpcm.delta[1] = (adaptationTable[((nibbles & 0x0F) >> 0)] * pWav->msadpcm.delta[1]) >> 8;
                    if (pWav->msadpcm.delta[1] < 16) {
                        pWav->msadpcm.delta[1] = 16;
                    }
                    pWav->msadpcm.prevFrames[1][0] = pWav->msadpcm.prevFrames[1][1];
                    pWav->msadpcm.prevFrames[1][1] = newSample1;
                    pWav->msadpcm.cachedFrames[2] = newSample0;
                    pWav->msadpcm.cachedFrames[3] = newSample1;
                    pWav->msadpcm.cachedFrameCount = 1;
                }
            }
        }
    }
    return totalFramesRead;
}